

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_avx2.cpp
# Opt level: O0

int __thiscall
ncnn::Padding_x86_avx2::forward(Padding_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  undefined4 uVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float _v [4];
  float _v_00 [4];
  __m256 _v_01;
  __m256 _v_02;
  __m128 v;
  __m128 v_00;
  __m128 v_01;
  __m128 v_02;
  __m256 v_03;
  __m256 v_04;
  __m256 v_05;
  __m256 v_06;
  bool bVar6;
  int iVar7;
  int iVar8;
  float *pfVar9;
  int iVar10;
  long in_RCX;
  Mat *in_RSI;
  long *in_RDI;
  Option opt_pack1;
  Mat bottom_blob_unpacked;
  Mat m_3;
  Mat borderm_3;
  int z_1;
  __m128 pad_value_7;
  int q_3;
  int outd_1;
  int outh_5;
  int outw_7;
  Mat m_2;
  __m128 pad_value_6;
  Mat borderm_2;
  int q_2;
  int front__1;
  size_t out_elemsize_5;
  int out_elempack_5;
  int outc_1;
  int outh_4;
  int outw_6;
  __m128 pad_value_5;
  size_t out_elemsize_4;
  int out_elempack_4;
  int outh_3;
  int outw_5;
  __m128 pad_value_4;
  size_t out_elemsize_3;
  int out_elempack_3;
  int outw_4;
  Mat m_1;
  Mat borderm_1;
  int z;
  __m256 pad_value_3;
  int q_1;
  int outd;
  int outh_2;
  int outw_3;
  Mat m;
  __m256 pad_value_2;
  Mat borderm;
  int q;
  int front_;
  size_t out_elemsize_2;
  int out_elempack_2;
  int outc;
  int outh_1;
  int outw_2;
  __m256 pad_value_1;
  size_t out_elemsize_1;
  int out_elempack_1;
  int outh;
  int outw_1;
  __m256 pad_value;
  size_t out_elemsize;
  int out_elempack;
  int outw;
  int elempack;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  int elembits;
  Mat *in_stack_fffffffffffff660;
  Mat *in_stack_fffffffffffff668;
  int _elempack;
  Mat *pMVar11;
  undefined4 in_stack_fffffffffffff670;
  int in_stack_fffffffffffff674;
  int in_stack_fffffffffffff678;
  int in_stack_fffffffffffff67c;
  int in_stack_fffffffffffff680;
  float in_stack_fffffffffffff684;
  undefined4 in_stack_fffffffffffff688;
  int in_stack_fffffffffffff68c;
  Mat *this_00;
  Mat *in_stack_fffffffffffff690;
  Mat *pMVar12;
  int in_stack_fffffffffffff698;
  int in_stack_fffffffffffff69c;
  int in_stack_fffffffffffff6a0;
  int in_stack_fffffffffffff6a4;
  int in_stack_fffffffffffff6a8;
  int in_stack_fffffffffffff6ac;
  Mat *in_stack_fffffffffffff6b0;
  Mat *in_stack_fffffffffffff6b8;
  undefined8 in_stack_fffffffffffff6d0;
  int in_stack_fffffffffffff6d8;
  int in_stack_fffffffffffff6dc;
  undefined4 in_stack_fffffffffffff6e0;
  int iVar13;
  undefined4 in_stack_fffffffffffff6e4;
  int in_stack_fffffffffffff6e8;
  int in_stack_fffffffffffff6ec;
  undefined8 in_stack_fffffffffffff6f0;
  undefined4 in_stack_fffffffffffff6f8;
  undefined4 in_stack_fffffffffffff6fc;
  Mat *in_stack_fffffffffffff700;
  undefined8 in_stack_fffffffffffff748;
  undefined8 in_stack_fffffffffffff750;
  Mat *in_stack_fffffffffffff758;
  int in_stack_fffffffffffff7a0;
  int in_stack_fffffffffffff7a4;
  int in_stack_fffffffffffff7a8;
  int in_stack_fffffffffffff7ac;
  Mat *in_stack_fffffffffffff7b0;
  undefined4 in_stack_fffffffffffff7b8;
  undefined4 in_stack_fffffffffffff7bc;
  int local_840;
  int local_834;
  int local_82c;
  int in_stack_fffffffffffff8b0;
  int in_stack_fffffffffffff8b4;
  int in_stack_fffffffffffff8b8;
  int in_stack_fffffffffffff8bc;
  Mat *in_stack_fffffffffffff8c0;
  Mat *in_stack_fffffffffffff8c8;
  Option *in_stack_fffffffffffff928;
  Mat *in_stack_fffffffffffff930;
  Mat *in_stack_fffffffffffff938;
  Padding *in_stack_fffffffffffff940;
  int local_674;
  undefined4 in_stack_fffffffffffff9a8;
  int iVar14;
  undefined4 in_stack_fffffffffffff9ac;
  undefined4 in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9b4;
  Mat *in_stack_fffffffffffff9b8;
  Padding_x86_avx2 *in_stack_fffffffffffff9c0;
  int local_5a0;
  int local_404;
  int local_3c8;
  int local_2e0;
  int local_1f4;
  Mat *local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  Mat *pMStack_a8;
  
  if (((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) &&
        (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0)) &&
       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 0)) &&
      ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 0 &&
       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 0)))) &&
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec) == 0)) {
    Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                   in_stack_fffffffffffff668);
    local_1f4 = 0;
  }
  else {
    iVar7 = Mat::elembits(in_RSI);
    if (iVar7 == 8) {
      local_1f4 = forward_int8(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                               (Mat *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                               (Option *)
                               CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
    }
    else {
      iVar7 = in_RSI->d;
      iVar3 = in_RSI->c;
      iVar10 = in_RSI->dims;
      iVar14 = in_RSI->elempack;
      _elempack = (int)((ulong)in_stack_fffffffffffff668 >> 0x20);
      if (iVar14 == 8) {
        if (iVar10 == 1) {
          iVar8 = in_RSI->w * 8 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                  *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
          if (iVar8 % 8 == 0) {
            local_82c = 8;
          }
          else {
            local_82c = 1;
            if (iVar8 % 4 == 0) {
              local_82c = 4;
            }
          }
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) % 8 == 0) &&
              (local_82c == 8)) && (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0)
             ) {
            Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                        (int)in_stack_fffffffffffff684,
                        CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                        in_stack_fffffffffffff674,(Allocator *)in_stack_fffffffffffff668);
            bVar6 = Mat::empty(in_stack_fffffffffffff668);
            if (!bVar6) {
              uVar1 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
              auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
              auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
              vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
              auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
              auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
              vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
              v_03[1] = (float)in_stack_fffffffffffff69c;
              v_03[0] = (float)in_stack_fffffffffffff698;
              v_03[2] = (float)in_stack_fffffffffffff6a0;
              v_03[3] = (float)in_stack_fffffffffffff6a4;
              v_03[4] = (float)in_stack_fffffffffffff6a8;
              v_03[5] = (float)in_stack_fffffffffffff6ac;
              v_03._24_8_ = in_stack_fffffffffffff6b0;
              padding_constant_pack8_avx
                        ((Mat *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                         (Mat *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                         in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8,
                         (int)((ulong)in_stack_fffffffffffff6d0 >> 0x20),
                         (int)in_stack_fffffffffffff6d0,v_03);
              return 0;
            }
            return -100;
          }
        }
        if (iVar10 == 2) {
          iVar8 = in_RSI->h * 8 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) +
                  *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          if (iVar8 % 8 == 0) {
            local_834 = 8;
          }
          else {
            local_834 = 1;
            if (iVar8 % 4 == 0) {
              local_834 = 4;
            }
          }
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 8 == 0) &&
              (local_834 == 8)) && (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0)
             ) {
            Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                        (int)in_stack_fffffffffffff684,in_stack_fffffffffffff680,
                        CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                        in_stack_fffffffffffff674,(Allocator *)in_stack_fffffffffffff668);
            bVar6 = Mat::empty(in_stack_fffffffffffff668);
            if (!bVar6) {
              uVar1 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
              auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
              auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
              vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
              auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
              auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
              vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
              v_04[1] = (float)in_stack_fffffffffffff69c;
              v_04[0] = (float)in_stack_fffffffffffff698;
              v_04[2] = (float)in_stack_fffffffffffff6a0;
              v_04[3] = (float)in_stack_fffffffffffff6a4;
              v_04[4] = (float)in_stack_fffffffffffff6a8;
              v_04[5] = (float)in_stack_fffffffffffff6ac;
              v_04._24_8_ = in_stack_fffffffffffff6b0;
              padding_constant_pack8_avx
                        ((Mat *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                         (Mat *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                         in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8,
                         (int)((ulong)in_stack_fffffffffffff6d0 >> 0x20),
                         (int)in_stack_fffffffffffff6d0,v_04);
              return 0;
            }
            return -100;
          }
        }
        if (iVar10 == 3) {
          iVar8 = iVar3 * 8 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) +
                  *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec);
          if (iVar8 % 8 == 0) {
            local_840 = 8;
          }
          else {
            local_840 = 1;
            if (iVar8 % 4 == 0) {
              local_840 = 4;
            }
          }
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) % 8 == 0) &&
              (local_840 == 8)) &&
             ((iVar8 == iVar3 * 8 ||
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0)))) {
            Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                        (int)in_stack_fffffffffffff684,in_stack_fffffffffffff680,
                        in_stack_fffffffffffff67c,
                        CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),_elempack,
                        (Allocator *)CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698));
            bVar6 = Mat::empty(in_stack_fffffffffffff668);
            if (!bVar6) {
              iVar7 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) / 8;
              for (local_2e0 = 0; local_2e0 < iVar8 / 8; local_2e0 = local_2e0 + 1) {
                Mat::channel(in_stack_fffffffffffff690,in_stack_fffffffffffff68c);
                if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0) == 0) {
                  uVar1 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
                  auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
                  auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
                  auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
                  auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
                  auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
                  auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
                  local_c0 = auVar5._0_8_;
                  uStack_b8 = auVar5._8_8_;
                  uStack_b0 = auVar4._0_8_;
                  pMStack_a8 = auVar4._8_8_;
                  in_stack_fffffffffffff748 = uStack_b8;
                  in_stack_fffffffffffff750 = uStack_b0;
                  in_stack_fffffffffffff758 = pMStack_a8;
                }
                else {
                  pfVar9 = Mat::operator_cast_to_float_
                                     ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8));
                  local_c0 = *(Mat **)(pfVar9 + (local_2e0 << 3));
                }
                if ((local_2e0 - iVar7 < 0) || (iVar3 <= local_2e0 - iVar7)) {
                  _v_01[1] = (float)in_stack_fffffffffffff67c;
                  _v_01[0] = (float)in_stack_fffffffffffff678;
                  _v_01[2] = (float)in_stack_fffffffffffff680;
                  _v_01[3] = in_stack_fffffffffffff684;
                  _v_01[4] = (float)in_stack_fffffffffffff688;
                  _v_01[5] = (float)in_stack_fffffffffffff68c;
                  _v_01._24_8_ = in_stack_fffffffffffff690;
                  Mat::fill(in_stack_fffffffffffff6b0,_v_01);
                }
                else {
                  Mat::channel(in_stack_fffffffffffff690,in_stack_fffffffffffff68c);
                  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0) {
                    v_05[1] = (float)in_stack_fffffffffffff69c;
                    v_05[0] = (float)in_stack_fffffffffffff698;
                    v_05[2] = (float)in_stack_fffffffffffff6a0;
                    v_05[3] = (float)in_stack_fffffffffffff6a4;
                    v_05[4] = (float)in_stack_fffffffffffff6a8;
                    v_05[5] = (float)in_stack_fffffffffffff6ac;
                    v_05._24_8_ = in_stack_fffffffffffff6b0;
                    padding_constant_pack8_avx
                              ((Mat *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                               (Mat *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                               in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8,
                               (int)((ulong)in_stack_fffffffffffff6d0 >> 0x20),
                               (int)in_stack_fffffffffffff6d0,v_05);
                  }
                  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1) {
                    padding_replicate_pack8_avx
                              (local_c0,in_stack_fffffffffffff758,
                               (int)((ulong)in_stack_fffffffffffff750 >> 0x20),
                               (int)in_stack_fffffffffffff750,
                               (int)((ulong)in_stack_fffffffffffff748 >> 0x20),
                               (int)in_stack_fffffffffffff748);
                  }
                  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 2) {
                    padding_reflect_pack8_avx
                              (in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,
                               in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8,
                               in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0);
                  }
                  Mat::~Mat((Mat *)0x67eebc);
                }
                Mat::~Mat((Mat *)0x67eecc);
              }
              return 0;
            }
            return -100;
          }
        }
        if ((iVar10 == 4) &&
           (iVar8 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8),
           iVar13 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec),
           *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0)) {
          pMVar11 = *(Mat **)(in_RCX + 8);
          Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                      (int)in_stack_fffffffffffff684,in_stack_fffffffffffff680,
                      in_stack_fffffffffffff67c,in_stack_fffffffffffff678,
                      CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                      in_stack_fffffffffffff698,
                      (Allocator *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
          bVar6 = Mat::empty(pMVar11);
          if (!bVar6) {
            for (local_3c8 = 0; local_3c8 < iVar3; local_3c8 = local_3c8 + 1) {
              if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0) == 0) {
                uVar1 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
                auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
                auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
                vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
                auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
                auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
                vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
              }
              else {
                Mat::operator_cast_to_float_
                          ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8));
              }
              for (local_404 = 0; local_404 < iVar7 + iVar8 + iVar13; local_404 = local_404 + 1) {
                Mat::channel(in_stack_fffffffffffff690,in_stack_fffffffffffff68c);
                Mat::depth((Mat *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                           (int)((ulong)pMVar11 >> 0x20));
                Mat::~Mat((Mat *)0x67f23f);
                if ((local_404 - *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) < 0) ||
                   (iVar7 <= local_404 - *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8))
                   ) {
                  _v_02[1] = (float)in_stack_fffffffffffff67c;
                  _v_02[0] = (float)in_stack_fffffffffffff678;
                  _v_02[2] = (float)in_stack_fffffffffffff680;
                  _v_02[3] = in_stack_fffffffffffff684;
                  _v_02[4] = (float)in_stack_fffffffffffff688;
                  _v_02[5] = (float)in_stack_fffffffffffff68c;
                  _v_02._24_8_ = in_stack_fffffffffffff690;
                  Mat::fill(in_stack_fffffffffffff6b0,_v_02);
                }
                else {
                  Mat::channel(in_stack_fffffffffffff690,in_stack_fffffffffffff68c);
                  Mat::depth((Mat *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                             (int)((ulong)pMVar11 >> 0x20));
                  Mat::~Mat((Mat *)0x67f344);
                  v_06[1] = (float)in_stack_fffffffffffff69c;
                  v_06[0] = (float)in_stack_fffffffffffff698;
                  v_06[2] = (float)in_stack_fffffffffffff6a0;
                  v_06[3] = (float)in_stack_fffffffffffff6a4;
                  v_06[4] = (float)in_stack_fffffffffffff6a8;
                  v_06[5] = (float)in_stack_fffffffffffff6ac;
                  v_06._24_8_ = in_stack_fffffffffffff6b0;
                  padding_constant_pack8_avx
                            ((Mat *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                             (Mat *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
                             in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8,
                             (int)((ulong)in_stack_fffffffffffff6d0 >> 0x20),
                             (int)in_stack_fffffffffffff6d0,v_06);
                  Mat::~Mat((Mat *)0x67f3a1);
                }
                Mat::~Mat((Mat *)0x67f3fc);
              }
            }
            return 0;
          }
          return -100;
        }
      }
      if (iVar14 == 4) {
        if (iVar10 == 1) {
          iVar8 = in_RSI->w * 4 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) +
                  *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
          if (iVar8 % 8 == 0) {
            in_stack_fffffffffffff6ec = 8;
          }
          else {
            in_stack_fffffffffffff6ec = 1;
            if (iVar8 % 4 == 0) {
              in_stack_fffffffffffff6ec = 4;
            }
          }
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) % 4 == 0) &&
              (in_stack_fffffffffffff6ec == 4)) &&
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0)) {
            Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                        (int)in_stack_fffffffffffff684,
                        CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                        in_stack_fffffffffffff674,(Allocator *)in_stack_fffffffffffff668);
            bVar6 = Mat::empty(in_stack_fffffffffffff668);
            if (!bVar6) {
              v[1] = (float)in_stack_fffffffffffff68c;
              v[0] = (float)in_stack_fffffffffffff688;
              v._8_8_ = in_stack_fffffffffffff690;
              padding_constant_pack4_sse
                        (in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0,
                         in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8,
                         in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0,v);
              return 0;
            }
            return -100;
          }
        }
        if (iVar10 == 2) {
          iVar8 = in_RSI->h * 4 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) +
                  *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          if (iVar8 % 8 == 0) {
            in_stack_fffffffffffff6e8 = 8;
          }
          else {
            in_stack_fffffffffffff6e8 = 1;
            if (iVar8 % 4 == 0) {
              in_stack_fffffffffffff6e8 = 4;
            }
          }
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 4 == 0) &&
              (in_stack_fffffffffffff6e8 == 4)) &&
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0)) {
            Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                        (int)in_stack_fffffffffffff684,in_stack_fffffffffffff680,
                        CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678),
                        in_stack_fffffffffffff674,(Allocator *)in_stack_fffffffffffff668);
            bVar6 = Mat::empty(in_stack_fffffffffffff668);
            if (!bVar6) {
              v_00[1] = (float)in_stack_fffffffffffff68c;
              v_00[0] = (float)in_stack_fffffffffffff688;
              v_00._8_8_ = in_stack_fffffffffffff690;
              padding_constant_pack4_sse
                        (in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0,
                         in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8,
                         in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0,v_00);
              return 0;
            }
            return -100;
          }
        }
        if (iVar10 == 3) {
          iVar8 = iVar3 * 4 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) +
                  *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec);
          if (iVar8 % 8 == 0) {
            iVar13 = 8;
          }
          else {
            iVar13 = 1;
            if (iVar8 % 4 == 0) {
              iVar13 = 4;
            }
          }
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) % 4 == 0) &&
              (iVar13 == 4)) &&
             ((iVar8 == iVar3 * 4 ||
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0)))) {
            Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                        (int)in_stack_fffffffffffff684,in_stack_fffffffffffff680,
                        in_stack_fffffffffffff67c,
                        CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),_elempack,
                        (Allocator *)CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698));
            bVar6 = Mat::empty(in_stack_fffffffffffff668);
            if (!bVar6) {
              iVar7 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) / 4;
              for (local_5a0 = 0; local_5a0 < iVar8 / 4; local_5a0 = local_5a0 + 1) {
                Mat::channel(in_stack_fffffffffffff690,in_stack_fffffffffffff68c);
                if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0) == 0) {
                  in_stack_fffffffffffff6a0 =
                       *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
                  pMVar11 = (Mat *)CONCAT44(in_stack_fffffffffffff6a0,in_stack_fffffffffffff6a0);
                  pMVar12 = (Mat *)CONCAT44(in_stack_fffffffffffff6a0,in_stack_fffffffffffff6a0);
                  in_stack_fffffffffffff6a4 = in_stack_fffffffffffff6a0;
                  in_stack_fffffffffffff6a8 = in_stack_fffffffffffff6a0;
                  in_stack_fffffffffffff6ac = in_stack_fffffffffffff6a0;
                }
                else {
                  pfVar9 = Mat::operator_cast_to_float_
                                     ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8));
                  pMVar11 = *(Mat **)(pfVar9 + (local_5a0 << 2));
                  pMVar12 = *(Mat **)(pfVar9 + (local_5a0 << 2) + 2);
                }
                if ((local_5a0 - iVar7 < 0) || (iVar3 <= local_5a0 - iVar7)) {
                  _v[1] = (float)in_stack_fffffffffffff67c;
                  _v[0] = (float)in_stack_fffffffffffff678;
                  _v[2] = (float)in_stack_fffffffffffff680;
                  _v[3] = in_stack_fffffffffffff684;
                  Mat::fill<float__vector(4)>
                            ((Mat *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),_v
                            );
                }
                else {
                  Mat::channel(in_stack_fffffffffffff690,in_stack_fffffffffffff68c);
                  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0) {
                    v_01[1] = (float)in_stack_fffffffffffff68c;
                    v_01[0] = (float)in_stack_fffffffffffff688;
                    v_01._8_8_ = in_stack_fffffffffffff690;
                    padding_constant_pack4_sse
                              (pMVar12,pMVar11,in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8,
                               in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0,v_01);
                  }
                  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1) {
                    padding_replicate_pack4_sse
                              (in_stack_fffffffffffff700,
                               (Mat *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8),
                               (int)((ulong)in_stack_fffffffffffff6f0 >> 0x20),
                               (int)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6ec,
                               in_stack_fffffffffffff6e8);
                  }
                  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 2) {
                    padding_reflect_pack4_sse
                              ((Mat *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
                               in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,
                               in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a4,
                               in_stack_fffffffffffff7a0);
                  }
                  Mat::~Mat((Mat *)0x67fe4b);
                }
                Mat::~Mat((Mat *)0x67fe58);
              }
              return 0;
            }
            return -100;
          }
        }
        if ((iVar10 == 4) &&
           (iVar10 = iVar7 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) +
                     *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec),
           *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 0)) {
          pMVar11 = *(Mat **)(in_RCX + 8);
          Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                      (int)in_stack_fffffffffffff684,in_stack_fffffffffffff680,
                      in_stack_fffffffffffff67c,in_stack_fffffffffffff678,
                      CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                      in_stack_fffffffffffff698,
                      (Allocator *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0));
          bVar6 = Mat::empty(pMVar11);
          if (!bVar6) {
            for (iVar14 = 0; iVar14 < iVar3; iVar14 = iVar14 + 1) {
              if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0) == 0) {
                uVar2 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
                pMVar12 = (Mat *)CONCAT44(uVar2,uVar2);
              }
              else {
                pfVar9 = Mat::operator_cast_to_float_
                                   ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8));
                pMVar12 = *(Mat **)(pfVar9 + (iVar14 << 2));
              }
              for (local_674 = 0; local_674 < iVar10; local_674 = local_674 + 1) {
                this_00 = (Mat *)&stack0xfffffffffffff8f8;
                Mat::channel(pMVar12,(int)((ulong)this_00 >> 0x20));
                Mat::depth((Mat *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                           (int)((ulong)pMVar11 >> 0x20));
                Mat::~Mat((Mat *)0x6800ea);
                if ((local_674 - *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) < 0) ||
                   (iVar7 <= local_674 - *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8))
                   ) {
                  _v_00[1] = (float)in_stack_fffffffffffff67c;
                  _v_00[0] = (float)in_stack_fffffffffffff678;
                  _v_00[2] = (float)in_stack_fffffffffffff680;
                  _v_00[3] = in_stack_fffffffffffff684;
                  Mat::fill<float__vector(4)>(this_00,_v_00);
                }
                else {
                  Mat::channel(pMVar12,(int)((ulong)this_00 >> 0x20));
                  Mat::depth((Mat *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                             (int)((ulong)pMVar11 >> 0x20));
                  Mat::~Mat((Mat *)0x6801ef);
                  v_02._8_8_ = pMVar12;
                  v_02._0_8_ = this_00;
                  padding_constant_pack4_sse
                            (in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0,
                             in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8,
                             in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0,v_02);
                  Mat::~Mat((Mat *)0x680249);
                }
                Mat::~Mat((Mat *)0x68029e);
              }
            }
            return 0;
          }
          return -100;
        }
      }
      Mat::Mat(in_stack_fffffffffffff668,in_stack_fffffffffffff660);
      if (iVar14 != 1) {
        convert_packing((Mat *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                        (Mat *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),
                        in_stack_fffffffffffff69c,(Option *)in_stack_fffffffffffff690);
      }
      local_1f4 = Padding::forward(in_stack_fffffffffffff940,in_stack_fffffffffffff938,
                                   in_stack_fffffffffffff930,in_stack_fffffffffffff928);
      Mat::~Mat((Mat *)0x6803e5);
    }
  }
  return local_1f4;
}

Assistant:

int Padding_x86_avx2::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}